

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O1

void __thiscall
ConfidentialValue_ConvertToConfidentialValue_Test::TestBody
          (ConfidentialValue_ConvertToConfidentialValue_Test *this)

{
  bool bVar1;
  undefined1 extraout_DL;
  char *message;
  AssertionResult gtest_ar;
  ByteData bytedata;
  AssertHelper AStack_68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [16];
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  void *local_30 [3];
  undefined8 local_18;
  undefined1 local_10;
  
  local_18 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_10 = extraout_DL;
  cfd::core::ConfidentialValue::ConvertToConfidentialValue((Amount *)local_30);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_40,"bytedata.GetHex().c_str()","\"010000000005f5e100\"",(char *)local_60[0].ptr_,
             "010000000005f5e100");
  if (local_60[0].ptr_ != local_50) {
    operator_delete(local_60[0].ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x93,message);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    if (local_60[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_60[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60[0].ptr_ + 8))();
      }
      local_60[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

TEST(ConfidentialValue, ConvertToConfidentialValue) {
  Amount amount = Amount::CreateBySatoshiAmount(100000000);
  ByteData bytedata = ConfidentialValue::ConvertToConfidentialValue(amount);
  EXPECT_STREQ(bytedata.GetHex().c_str(), "010000000005f5e100");
}